

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int FinalizeTokenProbas(VP8EncProba *proba)

{
  uint8_t proba_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint bit;
  long in_RDI;
  int use_new_p;
  int new_cost;
  int old_cost;
  int new_p;
  int old_p;
  int update_proba;
  int total;
  int nb;
  proba_t stats;
  int p;
  int c;
  int b;
  int t;
  int size;
  int has_changed;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  uint local_c;
  
  local_c = 0;
  local_10 = 0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < 0xb; local_20 = local_20 + 1) {
          uVar2 = *(uint *)(in_RDI + 0x424 + (long)local_14 * 0x420 + (long)local_18 * 0x84 +
                            (long)local_1c * 0x2c + (long)local_20 * 4);
          proba_00 = VP8CoeffsUpdateProba[local_14][local_18][local_1c][local_20];
          bVar1 = VP8CoeffsProba0[local_14][local_18][local_1c][local_20];
          uVar2 = CalcTokenProba(uVar2 & 0xffff,uVar2 >> 0x10);
          in_stack_ffffffffffffffb4 =
               BranchCost(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac);
          iVar3 = VP8BitCost(0,proba_00);
          iVar3 = in_stack_ffffffffffffffb4 + iVar3;
          iVar4 = BranchCost(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffac);
          iVar5 = VP8BitCost(1,proba_00);
          bit = (uint)(iVar4 + iVar5 + 0x800 < iVar3);
          iVar3 = VP8BitCost(bit,proba_00);
          local_10 = iVar3 + local_10;
          if (bit == 0) {
            *(byte *)(in_RDI + 4 + (long)local_14 * 0x108 + (long)local_18 * 0x21 +
                      (long)local_1c * 0xb + (long)local_20) = bVar1;
          }
          else {
            *(char *)(in_RDI + 4 + (long)local_14 * 0x108 + (long)local_18 * 0x21 +
                      (long)local_1c * 0xb + (long)local_20) = (char)uVar2;
            local_c = uVar2 != bVar1 | local_c;
            local_10 = local_10 + 0x800;
          }
        }
      }
    }
  }
  *(uint *)(in_RDI + 0x4da8) = local_c;
  return local_10;
}

Assistant:

static int FinalizeTokenProbas(VP8EncProba* const proba) {
  int has_changed = 0;
  int size = 0;
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const proba_t stats = proba->stats_[t][b][c][p];
          const int nb = (stats >> 0) & 0xffff;
          const int total = (stats >> 16) & 0xffff;
          const int update_proba = VP8CoeffsUpdateProba[t][b][c][p];
          const int old_p = VP8CoeffsProba0[t][b][c][p];
          const int new_p = CalcTokenProba(nb, total);
          const int old_cost = BranchCost(nb, total, old_p)
                             + VP8BitCost(0, update_proba);
          const int new_cost = BranchCost(nb, total, new_p)
                             + VP8BitCost(1, update_proba)
                             + 8 * 256;
          const int use_new_p = (old_cost > new_cost);
          size += VP8BitCost(use_new_p, update_proba);
          if (use_new_p) {  // only use proba that seem meaningful enough.
            proba->coeffs_[t][b][c][p] = new_p;
            has_changed |= (new_p != old_p);
            size += 8 * 256;
          } else {
            proba->coeffs_[t][b][c][p] = old_p;
          }
        }
      }
    }
  }
  proba->dirty_ = has_changed;
  return size;
}